

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

bool __thiscall front::syntax::SyntaxAnalyze::match_one_word(SyntaxAnalyze *this,Token tk)

{
  pointer pWVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [80];
  bool local_b8;
  Timestamp local_b0;
  string local_98;
  undefined1 local_78 [40];
  bool local_50;
  string local_48;
  
  uVar6 = this->matched_index + 1;
  pWVar1 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->word_list->
                     super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1) / 0x30) <= uVar6) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
                  ,0x665,"bool front::syntax::SyntaxAnalyze::match_one_word(Token)");
  }
  bVar2 = word::Word::match_token(pWVar1 + uVar6,tk);
  if (bVar2) {
    if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) == 0) ||
       (plVar3 = (long *)__dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                                 *(long *)(std::clog + -0x18)),
                                        &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
       plVar3 == (long *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_108,"Trace",(allocator<char> *)local_78);
      std::operator<<((ostream *)&std::clog,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
    }
    else {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(plVar3 + 0x29))->__data);
      if ((char)plVar3[0x10] != '\0') {
        (**(code **)(*plVar3 + 0x30))(plVar3);
        *(undefined1 *)(plVar3 + 0x10) = 0;
        plVar3[0x23] = 0;
        *(undefined1 *)(plVar3 + 0x24) = 1;
        AixLog::Tag::Tag((Tag *)local_108,(nullptr_t)0x0);
        AixLog::Tag::operator=((Tag *)(plVar3 + 0x11),(Tag *)local_108);
        AixLog::Tag::~Tag((Tag *)local_108);
        AixLog::Function::Function((Function *)local_108,(nullptr_t)0x0);
        AixLog::Function::operator=((Function *)(plVar3 + 0x17),(Function *)local_108);
        AixLog::Function::~Function((Function *)local_108);
        *(undefined1 *)(plVar3 + 0x25) = 1;
      }
      pthread_mutex_unlock((pthread_mutex_t *)(plVar3 + 0x29));
    }
    AixLog::Tag::Tag((Tag *)local_78);
    if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) == 0) ||
       (lVar4 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                        *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                               &AixLog::Log::typeinfo,0), lVar4 == 0)) {
      if (local_50 == false) {
        std::operator<<((ostream *)&std::clog,(string *)(local_78 + 8));
      }
    }
    else {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(lVar4 + 0x148))->__data);
      AixLog::Tag::operator=((Tag *)(lVar4 + 0x88),(Tag *)local_78);
      pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 0x148));
    }
    local_b0.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_b0._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001d8f28;
    local_b0.is_null_ = false;
    if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) == 0) ||
       (lVar4 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                        *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                               &AixLog::Log::typeinfo,0), lVar4 == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"%Y-%m-%d %H-%M-%S.#ms",(allocator<char> *)&local_98);
      AixLog::Timestamp::to_string((string *)local_108,&local_b0,&local_128);
      std::operator<<((ostream *)&std::clog,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(lVar4 + 0x148))->__data);
      *(bool *)(lVar4 + 0x120) = local_b0.is_null_;
      ((duration *)(lVar4 + 0x118))->__r = (rep)local_b0.time_point.__d.__r;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 0x148));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"match_one_word",&local_129);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/frontend/syntax_analyze.cpp"
               ,&local_12a);
    AixLog::Function::Function((Function *)local_108,&local_128,&local_98,0x660);
    if ((*(long *)(std::__cxx11::stringstream::stringstream + *(long *)(std::clog + -0x18)) == 0) ||
       (lVar4 = __dynamic_cast(*(long *)(std::__cxx11::stringstream::stringstream +
                                        *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                               &AixLog::Log::typeinfo,0), lVar4 == 0)) {
      if (local_b8 == false) {
        std::operator<<((ostream *)&std::clog,(string *)(local_108 + 8));
      }
    }
    else {
      std::recursive_mutex::lock((recursive_mutex *)&((pthread_mutex_t *)(lVar4 + 0x148))->__data);
      AixLog::Function::operator=((Function *)(lVar4 + 0xb8),(Function *)local_108);
      pthread_mutex_unlock((pthread_mutex_t *)(lVar4 + 0x148));
    }
    word::Word::get_self_abi_cxx11_
              (&local_48,
               (this->word_list->
               super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
               super__Vector_impl_data._M_start + this->matched_index + 1);
    poVar5 = std::operator<<((ostream *)&std::clog,(string *)&local_48);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_48);
    AixLog::Function::~Function((Function *)local_108);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_128);
    AixLog::Tag::~Tag((Tag *)local_78);
    this->matched_index = this->matched_index + 1;
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool SyntaxAnalyze::match_one_word(Token tk) {
  bool return_value = false;
  if (matched_index + 1 < word_list.size()) {
    if (word_list[matched_index + 1].match_token(tk)) {
      LOG(TRACE) << word_list[matched_index + 1].get_self() << std::endl;
      matched_index++;
      return_value = true;
    }
  } else {
    assert(false);
  }
  return return_value;
}